

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

pair<spvtools::opt::SExpression,_long> * __thiscall
spvtools::opt::SExpression::operator/
          (pair<spvtools::opt::SExpression,_long> *__return_storage_ptr__,SExpression *this,
          SExpression rhs_wrapper)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SENode *pSVar4;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  SENode *pSVar5;
  long lVar6;
  
  pSVar4 = rhs_wrapper.node_;
  pSVar5 = this->node_;
  iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4,this,pSVar4,rhs_wrapper.scev_);
  if ((CONCAT44(extraout_var,iVar3) != 0) &&
     (iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4),
     *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x30) == 0)) goto LAB_005d1966;
  iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
  if ((CONCAT44(extraout_var_01,iVar3) != 0) &&
     (iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4), CONCAT44(extraout_var_02,iVar3) != 0)) {
    iVar3 = (*pSVar5->_vptr_SENode[4])(pSVar5);
    lVar1 = *(long *)(CONCAT44(extraout_var_03,iVar3) + 0x30);
    iVar3 = (*pSVar4->_vptr_SENode[4])(pSVar4);
    lVar2 = *(long *)(CONCAT44(extraout_var_04,iVar3) + 0x30);
    lVar6 = lVar1 % lVar2;
    pSVar4 = ScalarEvolutionAnalysis::CreateConstant(this->scev_,lVar1 / lVar2);
    goto LAB_005d1971;
  }
  iVar3 = (*pSVar5->_vptr_SENode[10])(pSVar5);
  if (CONCAT44(extraout_var_05,iVar3) == 0) {
LAB_005d1966:
    pSVar4 = this->scev_->cached_cant_compute_;
  }
  else {
    if ((long)(pSVar5->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(pSVar5->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("lhs->GetChildren().size() == 2 && \"More than 2 operand for a multiply node.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,0x3d0,
                    "std::pair<SExpression, int64_t> spvtools::opt::SExpression::operator/(SExpression) const"
                   );
    }
    iVar3 = (*pSVar5->_vptr_SENode[10])(pSVar5);
    pSVar4 = anon_unknown_15::RemoveOneNodeFromMultiplyChain
                       ((SEMultiplyNode *)CONCAT44(extraout_var_06,iVar3),pSVar4);
    if (pSVar4 == pSVar5) goto LAB_005d1966;
  }
  lVar6 = 0;
LAB_005d1971:
  pSVar5 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar4->parent_analysis_,pSVar4);
  (__return_storage_ptr__->first).node_ = pSVar5;
  (__return_storage_ptr__->first).scev_ = pSVar4->parent_analysis_;
  __return_storage_ptr__->second = lVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<SExpression, int64_t> SExpression::operator/(
    SExpression rhs_wrapper) const {
  SENode* lhs = node_;
  SENode* rhs = rhs_wrapper.node_;
  // Check for division by 0.
  if (rhs->AsSEConstantNode() &&
      !rhs->AsSEConstantNode()->FoldToSingleValue()) {
    return {scev_->CreateCantComputeNode(), 0};
  }

  // Trivial case.
  if (lhs->AsSEConstantNode() && rhs->AsSEConstantNode()) {
    int64_t lhs_value = lhs->AsSEConstantNode()->FoldToSingleValue();
    int64_t rhs_value = rhs->AsSEConstantNode()->FoldToSingleValue();
    return {scev_->CreateConstant(lhs_value / rhs_value),
            lhs_value % rhs_value};
  }

  // look for a "c U / U" pattern.
  if (lhs->AsSEMultiplyNode()) {
    assert(lhs->GetChildren().size() == 2 &&
           "More than 2 operand for a multiply node.");
    SENode* res = RemoveOneNodeFromMultiplyChain(lhs->AsSEMultiplyNode(), rhs);
    if (res != lhs) {
      return {res, 0};
    }
  }

  return {scev_->CreateCantComputeNode(), 0};
}